

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O1

void opengv::relative_pose::modules::fivept_kneip::sPolynomial40
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[0x29eb];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x171a] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2bfb] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x175c] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2c3d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x17e0] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2cc1] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1822] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2d03] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x18a6] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2d87] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x18e8] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2dc9] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[0x2d30];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1e10] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2efe] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2062] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e0b] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x20a4] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e4d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x20e6] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e8f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2128] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2ed1] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x216a] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f13] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x21ac] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f55] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x21ee] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f97] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2230] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2fd9] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2440] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x301b] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x28a2] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3048] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2bfc] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x305d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2c3e] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x309f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2c80] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x30e1] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2cc2] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x3123] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2d04] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x3165] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2d46] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x31a7] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2d88] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x31e9] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2dca] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x322b] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2fda] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x326d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x322c] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x32af] / dVar1;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::sPolynomial40( Eigen::Matrix<double,66,197> & groebnerMatrix )
{
  groebnerMatrix(40,89) = -groebnerMatrix(39,170)/(groebnerMatrix(39,162));
  groebnerMatrix(40,90) = -groebnerMatrix(39,171)/(groebnerMatrix(39,162));
  groebnerMatrix(40,92) = -groebnerMatrix(39,173)/(groebnerMatrix(39,162));
  groebnerMatrix(40,93) = -groebnerMatrix(39,174)/(groebnerMatrix(39,162));
  groebnerMatrix(40,95) = -groebnerMatrix(39,176)/(groebnerMatrix(39,162));
  groebnerMatrix(40,96) = -groebnerMatrix(39,177)/(groebnerMatrix(39,162));
  groebnerMatrix(40,116) = groebnerMatrix(18,182)/(groebnerMatrix(18,175));
  groebnerMatrix(40,125) = -groebnerMatrix(39,178)/(groebnerMatrix(39,162));
  groebnerMatrix(40,126) = -groebnerMatrix(39,179)/(groebnerMatrix(39,162));
  groebnerMatrix(40,127) = -groebnerMatrix(39,180)/(groebnerMatrix(39,162));
  groebnerMatrix(40,128) = -groebnerMatrix(39,181)/(groebnerMatrix(39,162));
  groebnerMatrix(40,129) = -groebnerMatrix(39,182)/(groebnerMatrix(39,162));
  groebnerMatrix(40,130) = -groebnerMatrix(39,183)/(groebnerMatrix(39,162));
  groebnerMatrix(40,131) = -groebnerMatrix(39,184)/(groebnerMatrix(39,162));
  groebnerMatrix(40,132) = -groebnerMatrix(39,185)/(groebnerMatrix(39,162));
  groebnerMatrix(40,140) = -groebnerMatrix(39,186)/(groebnerMatrix(39,162));
  groebnerMatrix(40,157) = groebnerMatrix(18,187)/(groebnerMatrix(18,175));
  groebnerMatrix(40,170) = -groebnerMatrix(39,187)/(groebnerMatrix(39,162));
  groebnerMatrix(40,171) = -groebnerMatrix(39,188)/(groebnerMatrix(39,162));
  groebnerMatrix(40,172) = -groebnerMatrix(39,189)/(groebnerMatrix(39,162));
  groebnerMatrix(40,173) = -groebnerMatrix(39,190)/(groebnerMatrix(39,162));
  groebnerMatrix(40,174) = -groebnerMatrix(39,191)/(groebnerMatrix(39,162));
  groebnerMatrix(40,175) = -groebnerMatrix(39,192)/(groebnerMatrix(39,162));
  groebnerMatrix(40,176) = -groebnerMatrix(39,193)/(groebnerMatrix(39,162));
  groebnerMatrix(40,177) = -groebnerMatrix(39,194)/(groebnerMatrix(39,162));
  groebnerMatrix(40,185) = -groebnerMatrix(39,195)/(groebnerMatrix(39,162));
  groebnerMatrix(40,194) = -groebnerMatrix(39,196)/(groebnerMatrix(39,162));
}